

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQString * __thiscall SQStringTable::Add(SQStringTable *this,SQChar *news,SQInteger len)

{
  int iVar1;
  SQHash SVar2;
  ulong uVar3;
  size_t in_RDX;
  char *in_RSI;
  SQStringTable *in_RDI;
  SQString *t;
  SQString *s;
  SQHash h;
  SQHash newhash;
  SQString *local_38;
  size_t local_20;
  SQStringTable *this_00;
  SQString *local_8;
  
  local_20 = in_RDX;
  this_00 = in_RDI;
  if ((long)in_RDX < 0) {
    local_20 = strlen(in_RSI);
  }
  SVar2 = _hashstr(in_RSI,local_20);
  uVar3 = SVar2 & in_RDI->_numofslots - 1;
  local_38 = in_RDI->_strings[uVar3];
  while( true ) {
    if (local_38 == (SQString *)0x0) {
      local_8 = (SQString *)sq_vm_malloc(0x12e748);
      SQString::SQString(local_8);
      local_8->_sharedstate = in_RDI->_sharedstate;
      memcpy(local_8->_val,in_RSI,local_20);
      local_8->_val[local_20] = '\0';
      local_8->_len = local_20;
      local_8->_hash = SVar2;
      local_8->_next = in_RDI->_strings[uVar3];
      in_RDI->_strings[uVar3] = local_8;
      in_RDI->_slotused = in_RDI->_slotused + 1;
      if (in_RDI->_numofslots < in_RDI->_slotused) {
        Resize(this_00,(SQInteger)in_RSI);
      }
      return local_8;
    }
    if ((local_38->_len == local_20) && (iVar1 = memcmp(in_RSI,local_38->_val,local_20), iVar1 == 0)
       ) break;
    local_38 = local_38->_next;
  }
  return local_38;
}

Assistant:

SQString *SQStringTable::Add(const SQChar *news,SQInteger len)
{
    if(len<0)
        len = (SQInteger)scstrlen(news);
    SQHash newhash = ::_hashstr(news,len);
    SQHash h = newhash&(_numofslots-1);
    SQString *s;
    for (s = _strings[h]; s; s = s->_next){
        if(s->_len == len && (!memcmp(news,s->_val,sq_rsl(len))))
            return s; //found
    }

    SQString *t = (SQString *)SQ_MALLOC(sq_rsl(len)+sizeof(SQString));
    new (t) SQString;
    t->_sharedstate = _sharedstate;
    memcpy(t->_val,news,sq_rsl(len));
    t->_val[len] = _SC('\0');
    t->_len = len;
    t->_hash = newhash;
    t->_next = _strings[h];
    _strings[h] = t;
    _slotused++;
    if (_slotused > _numofslots)  /* too crowded? */
        Resize(_numofslots*2);
    return t;
}